

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O2

double __thiscall Mat::Dot(Mat *this,Mat *rhs)

{
  uint uVar1;
  ulong uVar2;
  ostream *poVar3;
  ulong uVar4;
  double dVar5;
  
  uVar1 = this->n_cols_ * this->n_rows_;
  if (uVar1 == rhs->n_cols_ * rhs->n_rows_) {
    uVar4 = 0;
    uVar2 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar2 = uVar4;
    }
    dVar5 = 0.0;
    for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      dVar5 = dVar5 + this->v_[uVar4] * rhs->v_[uVar4];
    }
    return dVar5;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"ERROR: Incompatible shape in Dot(Vector,Vector)");
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(1);
}

Assistant:

double Mat::Dot(const Mat &rhs)
{
	if ((*this).Size()!=rhs.Size()) {
		cerr << "ERROR: Incompatible shape in Dot(Vector,Vector)" << endl;
		exit(1);
	};
	double Sum = 0.0;
	for (int i=0; i<(*this).Size(); i++) Sum+=(*this).v_[i]*rhs.v_[i];
	return Sum;
}